

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

string * __thiscall Kernel::Term::headToString_abi_cxx11_(string *__return_storage_ptr__,Term *this)

{
  pointer pcVar1;
  List<unsigned_int> *pLVar2;
  Signature *pSVar3;
  bool bVar4;
  uint uVar5;
  Tuples *this_00;
  TermList TVar6;
  TermList TVar7;
  OperatorType *pOVar8;
  string *psVar9;
  long lVar10;
  uint i;
  uint extraout_EDX;
  uint var;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  char *__rhs;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  ulong *puVar16;
  string symbolsList;
  string typesList;
  uint proj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  TermList lambdaExp;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  TermList binding_1;
  TermList binding;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(this->_functor) {
  case 0xfffffff9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"$match(",(allocator<char> *)&symbolsList);
    return __return_storage_ptr__;
  case 0xfffffffa:
    puVar14 = *(uint **)&this[-1]._weight;
    puVar16 = *(ulong **)&this[-1]._maxRedLen;
    lambdaExp._content = *(uint64_t *)&this[-1]._functor;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbolsList,"[",(allocator<char> *)&typesList);
    bVar4 = true;
    uVar11 = extraout_RDX;
    while (uVar12 = (uint)uVar11, puVar14 != (uint *)0x0) {
      if (!bVar4) {
        std::__cxx11::string::append((char *)&symbolsList);
        uVar12 = extraout_EDX;
      }
      uVar5 = *puVar14;
      puVar14 = *(uint **)(puVar14 + 2);
      variableToString_abi_cxx11_((string *)&proj,(Term *)(ulong)uVar5,uVar12);
      std::operator+(&typesList,(string *)&proj," : ");
      std::__cxx11::string::append((string *)&symbolsList);
      std::__cxx11::string::~string((string *)&typesList);
      std::__cxx11::string::~string((string *)&proj);
      _proj = (pointer)*puVar16;
      puVar16 = (ulong *)puVar16[1];
      TermList::toString_abi_cxx11_(&typesList,(TermList *)&proj,false);
      std::__cxx11::string::append((string *)&symbolsList);
      std::__cxx11::string::~string((string *)&typesList);
      bVar4 = false;
      uVar11 = extraout_RDX_00;
    }
    std::__cxx11::string::append((char *)&symbolsList);
    std::operator+(&local_158,"(^",&symbolsList);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,
                   &local_158," : (");
    TermList::toString_abi_cxx11_(&local_138,&lambdaExp,false);
    std::operator+(&typesList,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,
                   &local_138);
    std::operator+(__return_storage_ptr__,&typesList,"))");
    std::__cxx11::string::~string((string *)&typesList);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&proj);
    pbVar15 = &local_158;
    goto LAB_0048ffa8;
  case 0xfffffffb:
    pLVar2 = *(List<unsigned_int> **)&this[-1]._weight;
    binding._content = *(uint64_t *)&this[-1]._maxRedLen;
    pOVar8 = Signature::Symbol::fnType((DAT_00a14190->_funs)._stack[this[-1]._functor]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbolsList,"",(allocator<char> *)&typesList);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typesList,"",(allocator<char> *)&proj);
    for (uVar12 = 0; uVar5 = Lib::List<unsigned_int>::length(pLVar2), uVar12 < uVar5;
        uVar12 = uVar12 + 1) {
      TVar6 = OperatorType::arg(pOVar8,uVar12);
      TVar7 = AtomicSort::boolSort();
      pSVar3 = DAT_00a14190;
      if (TVar6._content == TVar7._content) {
        uVar5 = Lib::List<unsigned_int>::nth(pLVar2,uVar12);
        lVar10 = 0x80;
      }
      else {
        uVar5 = Lib::List<unsigned_int>::nth(pLVar2,uVar12);
        lVar10 = 0x60;
      }
      pbVar15 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (*(long *)((long)&(pSVar3->_dividesNvalues)._capacity + lVar10) + (ulong)uVar5 * 8)
      ;
      std::__cxx11::string::append((string *)&symbolsList);
      std::operator+(&local_158,pbVar15,": ");
      lambdaExp = OperatorType::arg(pOVar8,uVar12);
      TermList::toString_abi_cxx11_(&local_138,&lambdaExp,false);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,
                     &local_158,&local_138);
      std::__cxx11::string::append((string *)&typesList);
      std::__cxx11::string::~string((string *)&proj);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      uVar5 = Lib::List<unsigned_int>::length(pLVar2);
      if (uVar12 != uVar5 - 1) {
        std::__cxx11::string::append((char *)&symbolsList);
        std::__cxx11::string::append((char *)&typesList);
      }
    }
    std::operator+(&local_d8,"$let([",&typesList);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lambdaExp,
                   &local_d8,"], [");
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lambdaExp,
                   &symbolsList);
    std::operator+(&local_158,&local_138,"] := ");
    TermList::toString_abi_cxx11_(&local_f8,&binding,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,
                   &local_158,&local_f8);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,", ");
    std::__cxx11::string::~string((string *)&proj);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&lambdaExp);
    pbVar15 = &local_d8;
    goto LAB_0048ff4f;
  case 0xfffffffc:
    lVar10 = *(long *)&this[-1]._functor;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbolsList,"",(allocator<char> *)&typesList);
    uVar13 = (ulong)(*(uint *)(lVar10 + 0xc) & 0xfffffff);
    while (pcVar1 = *(pointer *)(lVar10 + 0x28 + uVar13 * 8), ((uint)pcVar1 & 3) != 2) {
      _proj = pcVar1;
      TermList::toString_abi_cxx11_(&typesList,(TermList *)&proj,false);
      std::__cxx11::string::append((string *)&symbolsList);
      std::__cxx11::string::~string((string *)&typesList);
      if ((int)uVar13 != 1) {
        std::__cxx11::string::append((char *)&symbolsList);
      }
      uVar13 = uVar13 - 1;
    }
    std::operator+(&typesList,"[",&symbolsList);
    std::operator+(__return_storage_ptr__,&typesList,"]");
    goto LAB_0048ffa3;
  case 0xfffffffd:
    Formula::toString_abi_cxx11_(&symbolsList,*(Formula **)&this[-1]._functor);
    if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa532) & 1) != 0)) {
      std::operator+(&typesList,"$term{",&symbolsList);
      std::operator+(__return_storage_ptr__,&typesList,"}");
      goto LAB_0048ffa3;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&symbolsList);
    break;
  case 0xfffffffe:
    binding_1._content = *(uint64_t *)&this[-1]._maxRedLen;
    if (((binding_1._content & 3) == 0) && (bVar4 = isBoolean((Term *)binding_1._content), bVar4)) {
      std::__cxx11::string::string
                ((string *)&symbolsList,
                 (string *)(DAT_00a14190->_preds)._stack[(int)this[-1]._functor]);
      pOVar8 = Signature::Symbol::predType((DAT_00a14190->_preds)._stack[this[-1]._functor]);
    }
    else {
      psVar9 = Signature::functionName_abi_cxx11_(DAT_00a14190,this[-1]._functor);
      std::__cxx11::string::string((string *)&symbolsList,(string *)psVar9);
      pOVar8 = Signature::Symbol::fnType((DAT_00a14190->_funs)._stack[this[-1]._functor]);
    }
    pLVar2 = *(List<unsigned_int> **)&this[-1]._weight;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typesList,"",(allocator<char> *)&proj);
    for (uVar12 = 0; uVar5 = Lib::List<unsigned_int>::length(pLVar2), uVar12 < uVar5;
        uVar12 = uVar12 + 1) {
      uVar5 = Lib::List<unsigned_int>::nth(pLVar2,uVar12);
      variableToString_abi_cxx11_((string *)&proj,(Term *)(ulong)uVar5,var);
      std::__cxx11::string::append((string *)&typesList);
      std::__cxx11::string::~string((string *)&proj);
      uVar5 = Lib::List<unsigned_int>::length(pLVar2);
      if (uVar12 < uVar5 - 1) {
        std::__cxx11::string::append((char *)&typesList);
      }
    }
    uVar12 = Lib::List<unsigned_int>::length(pLVar2);
    if (uVar12 != 0) {
      std::operator+(&local_158,"(",&typesList);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,
                     &local_158,")");
      std::__cxx11::string::operator=((string *)&typesList,(string *)&proj);
      std::__cxx11::string::~string((string *)&proj);
      std::__cxx11::string::~string((string *)&local_158);
    }
    std::operator+(&local_50,"$let(",&symbolsList);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binding,
                   &local_50,": ");
    OperatorType::toString_abi_cxx11_(&local_70,pOVar8);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binding,
                   &local_70);
    std::operator+(&local_d8,&local_f8,", ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lambdaExp,
                   &local_d8,&symbolsList);
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lambdaExp,
                   &typesList);
    std::operator+(&local_158,&local_138," := ");
    TermList::toString_abi_cxx11_(&local_90,&binding_1,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,
                   &local_158,&local_90);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proj,", ");
    std::__cxx11::string::~string((string *)&proj);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&lambdaExp);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&binding);
    pbVar15 = &local_50;
LAB_0048ff4f:
    std::__cxx11::string::~string((string *)pbVar15);
LAB_0048ffa3:
    pbVar15 = &typesList;
LAB_0048ffa8:
    std::__cxx11::string::~string((string *)pbVar15);
    break;
  case 0xffffffff:
    Formula::toString_abi_cxx11_(&typesList,*(Formula **)&this[-1]._functor);
    std::operator+(&symbolsList,"$ite(",&typesList);
    std::operator+(__return_storage_ptr__,&symbolsList,", ");
LAB_0048f645:
    std::__cxx11::string::~string((string *)&symbolsList);
    psVar9 = &typesList;
    goto LAB_0048ffb2;
  default:
    uVar13 = this->_args[0]._content;
    if ((uVar13 & 0x20) == 0) {
      this_00 = Theory::tuples();
      bVar4 = Theory::Tuples::findProjection
                        (this_00,this->_functor,SUB41(((uint)this->_args[0]._content & 0x10) >> 4,0)
                         ,&proj);
      if (bVar4) {
        Lib::Int::toString_abi_cxx11_(&typesList,(Int *)((ulong)_proj & 0xffffffff),i);
        std::operator+(&symbolsList,"$proj(",&typesList);
        std::operator+(__return_storage_ptr__,&symbolsList,", ");
        goto LAB_0048f645;
      }
      uVar13 = this->_args[0]._content;
    }
    if (((uVar13 & 0x30) == 0) && ((DAT_00a14190->_funs)._stack[this->_functor]->_comb != NOT_COMB))
    {
      __rhs = "";
    }
    else {
      __rhs = "(";
      if ((*(uint *)&this->field_0xc & 0xfffffff) == 0) {
        __rhs = "";
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbolsList,"",(allocator<char> *)&typesList);
    uVar13 = this->_args[0]._content;
    if ((uVar13 & 0x10) == 0) {
      if ((uVar13 & 0x20) == 0) {
        functionName_abi_cxx11_(this);
        goto LAB_0048f6e5;
      }
      if ((this->_functor == 1 & (*(byte *)(Lib::env + 0xa532) | *(byte *)(Lib::env + 0x913a))) == 1
         ) {
        std::__cxx11::string::assign((char *)&symbolsList);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&symbolsList);
      }
    }
    else {
LAB_0048f6e5:
      std::__cxx11::string::_M_assign((string *)&symbolsList);
    }
    std::operator+(__return_storage_ptr__,&symbolsList,__rhs);
  }
  psVar9 = &symbolsList;
LAB_0048ffb2:
  std::__cxx11::string::~string((string *)psVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string Term::headToString() const
{
  if (isSpecial()) {
    const Term::SpecialTermData* sd = getSpecialData();

    switch(specialFunctor()) {
      case SpecialFunctor::FORMULA: {
        ASS_EQ(arity(), 0);
        std::string formula = sd->getFormula()->toString();
        return env.options->showFOOL() ? "$term{" + formula + "}" : formula;
      }
      case SpecialFunctor::LET: {
        ASS_EQ(arity(), 1);
        TermList binding = sd->getBinding();
        bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
        std::string functor = isPredicate ? env.signature->predicateName(sd->getFunctor())
                                      : env.signature->functionName(sd->getFunctor());
        OperatorType* type = isPredicate ? env.signature->getPredicate(sd->getFunctor())->predType()
                                         : env.signature->getFunction(sd->getFunctor())->fnType();

        const VList* variables = sd->getVariables();
        std::string variablesList = "";
        for (unsigned i = 0; i < VList::length(variables); i++) {
          unsigned var = VList::nth(variables, i);
          variablesList += Term::variableToString(var);
          if (i < VList::length(variables) - 1) {
            variablesList += ", ";
          }
        }
        if (VList::length(variables)) {
          variablesList = "(" + variablesList + ")";
        }
        return "$let(" + functor + ": " + type->toString() + ", " + functor + variablesList + " := " + binding.toString() + ", ";
      }
      case SpecialFunctor::ITE: {
        ASS_EQ(arity(),2);
        return "$ite(" + sd->getCondition()->toString() + ", ";
      }
      case SpecialFunctor::TUPLE: {
        ASS_EQ(arity(), 0);
        Term* term = sd->getTupleTerm();
        std::string termList = "";
        Term::Iterator tit(term);
        unsigned i = term->arity();
        while (tit.hasNext()) {
          termList += tit.next().toString();
          if (--i > 0) {
            termList += ", ";
          }
        }
        return "[" + termList + "]";
      }
      case SpecialFunctor::LET_TUPLE: {
        ASS_EQ(arity(), 1);
        VList* symbols = sd->getTupleSymbols();
        unsigned tupleFunctor = sd->getFunctor();
        TermList binding = sd->getBinding();

        OperatorType* fnType = env.signature->getFunction(tupleFunctor)->fnType();

        std::string symbolsList = "";
        std::string typesList = "";
        for (unsigned i = 0; i < VList::length(symbols); i++) {
          Signature::Symbol* symbol = (fnType->arg(i) == AtomicSort::boolSort())
            ? env.signature->getPredicate(VList::nth(symbols, i))
            : env.signature->getFunction(VList::nth(symbols, i));
          symbolsList += symbol->name();
          typesList += symbol->name() + ": " + fnType->arg(i).toString();
          if (i != VList::length(symbols) - 1) {
            symbolsList += ", ";
            typesList += ", ";
          }
        }

        return "$let([" + typesList + "], [" + symbolsList + "] := " + binding.toString() + ", ";
      }
      case SpecialFunctor::LAMBDA: {
        VList* vars = sd->getLambdaVars();
        SList* sorts = sd->getLambdaVarSorts();
        TermList lambdaExp = sd->getLambdaExp();

        std::string varList = "[";

        VList::Iterator vs(vars);
        SList::Iterator ss(sorts);
        bool first = true;
        while(vs.hasNext()) {
          if (!first){
            varList += ", ";
          }else{ first = false; }
          varList += Term::variableToString(vs.next()) + " : ";
          varList += ss.next().toString();
        }
        varList += "]";
        return "(^" + varList + " : (" + lambdaExp.toString() + "))";
      }
      case SpecialFunctor::MATCH: {
        // we simply let the arguments be written out
        return "$match(";
      }
      default:
        ASSERTION_VIOLATION;
    }
  } else {
    unsigned proj;
    if (!isSort() && Theory::tuples()->findProjection(functor(), isLiteral(), proj)) {
      return "$proj(" + Int::toString(proj) + ", ";
    }
    bool print = (isLiteral() || isSort() ||
                 (env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB)) && arity();
    std::string name = "";
    if(isLiteral()) {
      name = static_cast<const Literal *>(this)->predicateName();
    } else if (isSort()) {
      const AtomicSort* asSort = static_cast<const AtomicSort *>(this);
      if(env.options->showFOOL() && asSort->isBoolSort()){
        name = "$bool";
      } else {
        name = asSort->typeConName();
      }
    } else {
      name = functionName();
    }
    return name + (print ? "(" : "");
  }
}